

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_read_format_cpio_filename.c
# Opt level: O2

void test_read_format_cpio_filename_UTF8_UTF8_jp(void)

{
  int iVar1;
  wchar_t wVar2;
  mode_t mVar3;
  char *pcVar4;
  archive_conflict *a;
  la_int64_t lVar5;
  archive_entry *ae;
  
  pcVar4 = setlocale(6,"en_US.UTF-8");
  if (pcVar4 != (char *)0x0) {
    extract_reference_file("test_read_format_cpio_filename_utf8_jp.cpio");
    a = (archive_conflict *)archive_read_new();
    assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_read_format_cpio_filename.c"
                     ,L'\x9d',(uint)(a != (archive_conflict *)0x0),
                     "(a = archive_read_new()) != NULL",(void *)0x0);
    iVar1 = archive_read_support_filter_all((archive *)a);
    assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_read_format_cpio_filename.c"
                        ,L'\x9e',0,"ARCHIVE_OK",(long)iVar1,"archive_read_support_filter_all(a)",a);
    iVar1 = archive_read_support_format_all((archive *)a);
    assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_read_format_cpio_filename.c"
                        ,L'\x9f',0,"ARCHIVE_OK",(long)iVar1,"archive_read_support_format_all(a)",a);
    wVar2 = archive_read_open_filename(a,"test_read_format_cpio_filename_utf8_jp.cpio",0x2800);
    assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_read_format_cpio_filename.c"
                        ,L'¡',0,"ARCHIVE_OK",(long)wVar2,
                        "archive_read_open_filename(a, refname, 10240)",a);
    iVar1 = archive_read_next_header((archive *)a,&ae);
    assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_read_format_cpio_filename.c"
                        ,L'¤',0,"ARCHIVE_OK",(long)iVar1,"archive_read_next_header(a, &ae)",a);
    mVar3 = archive_entry_filetype(ae);
    assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_read_format_cpio_filename.c"
                        ,L'¥',0x8000,"AE_IFREG",(ulong)mVar3,"archive_entry_filetype(ae)",
                        (void *)0x0);
    pcVar4 = archive_entry_pathname(ae);
    assertion_equal_string
              ("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_read_format_cpio_filename.c"
               ,L'§',anon_var_dwarf_8ba2e + 0x36,"\"\\xe6\\xbc\\xa2\\xe5\\xad\\x97.txt\"",pcVar4,
               "archive_entry_pathname(ae)",(void *)0x0,L'\0');
    lVar5 = archive_entry_size(ae);
    assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_read_format_cpio_filename.c"
                        ,L'¨',8,"8",lVar5,"archive_entry_size(ae)",(void *)0x0);
    iVar1 = archive_read_next_header((archive *)a,&ae);
    assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_read_format_cpio_filename.c"
                        ,L'«',0,"ARCHIVE_OK",(long)iVar1,"archive_read_next_header(a, &ae)",a);
    mVar3 = archive_entry_filetype(ae);
    assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_read_format_cpio_filename.c"
                        ,L'¬',0x8000,"AE_IFREG",(ulong)mVar3,"archive_entry_filetype(ae)",
                        (void *)0x0);
    pcVar4 = archive_entry_pathname(ae);
    assertion_equal_string
              ("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_read_format_cpio_filename.c"
               ,L'­',anon_var_dwarf_671c9 + 0x10,"\"\\xe8\\xa1\\xa8.txt\"",pcVar4,
               "archive_entry_pathname(ae)",(void *)0x0,L'\0');
    lVar5 = archive_entry_size(ae);
    assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_read_format_cpio_filename.c"
                        ,L'®',4,"4",lVar5,"archive_entry_size(ae)",(void *)0x0);
    iVar1 = archive_read_next_header((archive *)a,&ae);
    assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_read_format_cpio_filename.c"
                        ,L'²',1,"ARCHIVE_EOF",(long)iVar1,"archive_read_next_header(a, &ae)",a);
    iVar1 = archive_filter_code((archive *)a,0);
    assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_read_format_cpio_filename.c"
                        ,L'µ',0,"ARCHIVE_FILTER_NONE",(long)iVar1,"archive_filter_code(a, 0)",a);
    iVar1 = archive_format((archive *)a);
    assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_read_format_cpio_filename.c"
                        ,L'¶',0x10001,"ARCHIVE_FORMAT_CPIO_POSIX",(long)iVar1,"archive_format(a)",a
                       );
    iVar1 = archive_read_close((archive *)a);
    assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_read_format_cpio_filename.c"
                        ,L'¹',0,"ARCHIVE_OK",(long)iVar1,"archive_read_close(a)",(void *)0x0);
    iVar1 = archive_read_free((archive *)a);
    assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_read_format_cpio_filename.c"
                        ,L'º',0,"ARCHIVE_OK",(long)iVar1,"archive_read_free(a)",(void *)0x0);
    return;
  }
  skipping_setup("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_read_format_cpio_filename.c"
                 ,L'\x98');
  test_skipping("en_US.UTF-8 locale not available on this system.");
  return;
}

Assistant:

DEFINE_TEST(test_read_format_cpio_filename_UTF8_UTF8_jp)
{
#if defined(_WIN32) && !defined(__CYGWIN__)
	/* Since we explicitly DON'T set hdrcharset=UTF-8 below */
	skipping("Windows defaults to OEMCP, not UTF-8");
	return;
#else
	const char *refname = "test_read_format_cpio_filename_utf8_jp.cpio";
	struct archive *a;
	struct archive_entry *ae;

	/*
	 * Read UTF-8 filename in en_US.UTF-8 without "hdrcharset=UTF-8" option.
	 */
	if (NULL == setlocale(LC_ALL, "en_US.UTF-8")) {
		skipping("en_US.UTF-8 locale not available on this system.");
		return;
	}
	extract_reference_file(refname);

	assert((a = archive_read_new()) != NULL);
	assertEqualIntA(a, ARCHIVE_OK, archive_read_support_filter_all(a));
	assertEqualIntA(a, ARCHIVE_OK, archive_read_support_format_all(a));
	assertEqualIntA(a, ARCHIVE_OK,
	    archive_read_open_filename(a, refname, 10240));

	/* Verify regular file. */
	assertEqualIntA(a, ARCHIVE_OK, archive_read_next_header(a, &ae));
	assertEqualInt(AE_IFREG, archive_entry_filetype(ae));
	assertEqualString("\xe6\xbc\xa2\xe5\xad\x97.txt",
	    archive_entry_pathname(ae));
	assertEqualInt(8, archive_entry_size(ae));

	/* Verify regular file. */
	assertEqualIntA(a, ARCHIVE_OK, archive_read_next_header(a, &ae));
	assertEqualInt(AE_IFREG, archive_entry_filetype(ae));
	assertEqualString("\xe8\xa1\xa8.txt", archive_entry_pathname(ae));
	assertEqualInt(4, archive_entry_size(ae));


	/* End of archive. */
	assertEqualIntA(a, ARCHIVE_EOF, archive_read_next_header(a, &ae));

	/* Verify archive format. */
	assertEqualIntA(a, ARCHIVE_FILTER_NONE, archive_filter_code(a, 0));
	assertEqualIntA(a, ARCHIVE_FORMAT_CPIO_POSIX, archive_format(a));

	/* Close the archive. */
	assertEqualInt(ARCHIVE_OK, archive_read_close(a));
	assertEqualInt(ARCHIVE_OK, archive_read_free(a));
#endif
}